

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O0

void __thiscall booster::aio::buffer_impl<char_*>::add(buffer_impl<char_*> *this,char *p,size_t s)

{
  size_type sVar1;
  vector<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  *in_RDX;
  value_type *in_RSI;
  int *in_RDI;
  entry tmp;
  value_type *in_stack_ffffffffffffffd8;
  vector<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  *in_stack_ffffffffffffffe0;
  
  if (in_RDX != (vector<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                 *)0x0) {
    if (*in_RDI == 0) {
      *(value_type **)(in_RDI + 2) = in_RSI;
      *(vector<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
        **)(in_RDI + 4) = in_RDX;
      *in_RDI = 1;
    }
    else {
      if (*in_RDI == 1) {
        std::
        vector<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
        ::push_back(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      }
      std::
      vector<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
      ::push_back(in_RDX,in_RSI);
      sVar1 = std::
              vector<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
              ::size((vector<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                      *)(in_RDI + 6));
      *in_RDI = (int)sVar1;
    }
  }
  return;
}

Assistant:

void add(Pointer p,size_t s)
			{
				if(s==0)
					return;
				if(size_ == 0) {
					entry_.ptr = p;
					entry_.size = s;
					size_ = 1;
					return;
				}
				else if(size_ == 1) {
					vec_.push_back(entry_);
				}
				entry tmp = { p,s };
				vec_.push_back(tmp);
				size_ = vec_.size();
			}